

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTransaction::SetTxOutCommitment
          (ConfidentialTransaction *this,uint32_t index,ConfidentialAssetId *asset,
          ConfidentialValue *value,ConfidentialNonce *nonce,ByteData *surjection_proof,
          ByteData *range_proof)

{
  CfdException *this_00;
  ulong uVar1;
  undefined4 in_register_00000034;
  undefined1 local_e0 [32];
  uint32_t local_c0;
  int ret;
  ConfidentialValue *local_b8;
  ConfidentialAssetId *local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_c0 = index;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
            (this,CONCAT44(in_register_00000034,index),0x8fa,"SetTxOutCommitment");
  local_b0 = asset;
  ConfidentialAssetId::GetData((ByteData *)local_e0,asset);
  ByteData::GetBytes(&local_48,(ByteData *)local_e0);
  if ((pointer)local_e0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e0._0_8_);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,&(value->data_).data_
            );
  ByteData::GetBytes(&local_60,(ByteData *)local_e0);
  if ((pointer)local_e0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e0._0_8_);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e0,&(nonce->data_).data_
            );
  ByteData::GetBytes(&local_78,(ByteData *)local_e0);
  if ((pointer)local_e0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_e0._0_8_);
  }
  local_b8 = value;
  ByteData::GetBytes(&local_90,surjection_proof);
  ByteData::GetBytes(&local_a8,range_proof);
  uVar1 = (ulong)local_c0;
  ret = wally_tx_elements_output_commitment_set
                  ((wally_tx_output *)
                   (uVar1 * 0x70 +
                   *(long *)((long)(this->super_AbstractTransaction).wally_tx_pointer_ + 0x20)),
                   local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ConfidentialTxOut::SetCommitment
              ((this->vout_).
               super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar1,local_b0,local_b8,nonce,
               surjection_proof,range_proof);
    if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  local_e0._0_8_ = "cfdcore_elements_transaction.cpp";
  local_e0._8_4_ = 0x90a;
  local_e0._16_8_ = "SetTxOutCommitment";
  logger::log<int&>((CfdSourceLocation *)local_e0,kCfdLogLevelWarning,
                    "wally_tx_elements_output_commitment_set NG[{}].",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_e0._0_8_ = local_e0 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"set commitment error.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_e0);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialTransaction::SetTxOutCommitment(
    uint32_t index, const ConfidentialAssetId &asset,
    const ConfidentialValue &value, const ConfidentialNonce &nonce,
    const ByteData &surjection_proof, const ByteData &range_proof) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);

  const std::vector<uint8_t> &asset_data = asset.GetData().GetBytes();
  const std::vector<uint8_t> &value_data = value.GetData().GetBytes();
  const std::vector<uint8_t> &nonce_data = nonce.GetData().GetBytes();
  const std::vector<uint8_t> &surjection_data = surjection_proof.GetBytes();
  const std::vector<uint8_t> &range_data = range_proof.GetBytes();

  struct wally_tx *tx = static_cast<struct wally_tx *>(wally_tx_pointer_);
  int ret = wally_tx_elements_output_commitment_set(
      &tx->outputs[index], asset_data.data(), asset_data.size(),
      value_data.data(), value_data.size(), nonce_data.data(),
      nonce_data.size(), surjection_data.data(), surjection_data.size(),
      range_data.data(), range_data.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_elements_output_commitment_set NG[{}].",
        ret);
    throw CfdException(kCfdIllegalStateError, "set commitment error.");
  }

  vout_[index].SetCommitment(
      asset, value, nonce, surjection_proof, range_proof);
}